

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

string * PacketProcessor::DickWinder(string *__return_storage_ptr__,string *str,uchar emulti)

{
  ulong uVar1;
  undefined7 in_register_00000011;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  string newstr;
  string buffer;
  _Alloc_hider local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  string *local_38;
  
  local_78._M_p = &local_68;
  local_70 = 0;
  local_68 = '\0';
  uVar1 = str->_M_string_length;
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  if ((int)CONCAT71(in_register_00000011,emulti) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  else {
    std::__cxx11::string::reserve((ulong)&local_78);
    uVar2 = 0;
    uVar4 = uVar1 & 0xffffffff;
    if ((int)uVar1 < 1) {
      uVar4 = uVar2;
    }
    local_38 = __return_storage_ptr__;
    for (; __return_storage_ptr__ = local_38, uVar4 != uVar2; uVar2 = uVar2 + 1) {
      cVar3 = (char)&local_58;
      if ((byte)(str->_M_dataplus)._M_p[uVar2] % emulti != 0) {
        cVar3 = (char)&local_78;
        if (local_50 != 0) {
          std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (local_58,local_58 + local_50);
          std::__cxx11::string::append((string *)&local_78);
          local_50 = 0;
          *local_58 = 0;
        }
      }
      std::__cxx11::string::push_back(cVar3);
    }
    if (local_50 != 0) {
      std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (local_58,local_58 + local_50);
      std::__cxx11::string::append((string *)&local_78);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_78._M_p == &local_68) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_60;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
    }
    __return_storage_ptr__->_M_string_length = local_70;
    local_70 = 0;
    local_68 = '\0';
    local_78._M_p = &local_68;
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string PacketProcessor::DickWinder(const std::string &str, unsigned char emulti)
{
	std::string newstr;
	int length = str.length();
	std::string buffer;
	unsigned char c;

	if (emulti == 0)
	{
		return str;
	}

	newstr.reserve(length);

	for (int i = 0; i < length; ++i)
	{
		c = str[i];

		if (c % emulti == 0)
		{
			buffer += c;
		}
		else
		{
			if (buffer.length() > 0)
			{
				std::reverse(buffer.begin(), buffer.end());
				newstr += buffer;
				buffer.clear();
			}
			newstr += c;
		}
	}

	if (buffer.length() > 0)
	{
		std::reverse(buffer.begin(), buffer.end());
		newstr += buffer;
	}

	return newstr;
}